

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O3

Abc_Cex_t * Saig_ManCbaFindCexCareBits(Aig_Man_t *pAig,Abc_Cex_t *pCex,int nInputs,int fVerbose)

{
  Abc_Cex_t *p;
  int iVar1;
  Saig_ManCba_t *p_00;
  Aig_Man_t *pAVar2;
  Vec_Int_t *vReasons;
  Vec_Int_t *__ptr;
  Abc_Cex_t *p_01;
  long lVar3;
  long lVar4;
  int level;
  timespec ts;
  timespec local_50;
  Aig_Man_t *local_40;
  Abc_Cex_t *local_38;
  
  clock_gettime(3,&local_50);
  iVar1 = clock_gettime(3,&local_50);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  p_00 = (Saig_ManCba_t *)calloc(1,0x38);
  p_00->pAig = pAig;
  p_00->pCex = pCex;
  p_00->nInputs = nInputs;
  p_00->fVerbose = fVerbose;
  local_38 = pCex;
  pAVar2 = Saig_ManCbaUnrollWithCex(pAig,pCex,nInputs,&p_00->vMapPiF2A,&p_00->vReg2Frame);
  p_00->pFrames = pAVar2;
  vReasons = Saig_ManCbaFindReason(p_00);
  if (p_00->vReg2Frame != (Vec_Vec_t *)0x0) {
    Saig_ManCbaShrink(p_00);
  }
  if (fVerbose != 0) {
    local_40 = pAig;
    __ptr = Saig_ManCbaReason2Inputs(p_00,vReasons);
    printf("Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",
           (ulong)(uint)pAVar2->nObjs[2],(ulong)(uint)vReasons->nSize,
           (ulong)(uint)(p_00->pAig->nTruePis - p_00->nInputs),(ulong)(uint)__ptr->nSize);
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
    Abc_Print((int)__ptr,"%s =","Time");
    level = 3;
    iVar1 = clock_gettime(3,&local_50);
    pAig = local_40;
    if (iVar1 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    Abc_Print(level,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
  }
  p_01 = Saig_ManCbaReason2Cex(p_00,vReasons);
  if (vReasons->pArray != (int *)0x0) {
    free(vReasons->pArray);
  }
  free(vReasons);
  Saig_ManCbaStop(p_00);
  p = local_38;
  if (fVerbose != 0) {
    printf("Real ");
    Abc_CexPrintStats(p);
    printf("Care ");
    Abc_CexPrintStats(p_01);
  }
  Aig_ManCleanMarkAB(pAig);
  return p_01;
}

Assistant:

Abc_Cex_t * Saig_ManCbaFindCexCareBits( Aig_Man_t * pAig, Abc_Cex_t * pCex, int nInputs, int fVerbose )
{
    Saig_ManCba_t * p;
    Vec_Int_t * vReasons;
    Abc_Cex_t * pCare;
    abctime clk = Abc_Clock();

    clk = Abc_Clock();
    p = Saig_ManCbaStart( pAig, pCex, nInputs, fVerbose );

//    p->vReg2Frame = Vec_VecStart( pCex->iFrame );
//    p->vReg2Value = Vec_VecStart( pCex->iFrame );
    p->pFrames = Saig_ManCbaUnrollWithCex( pAig, pCex, nInputs, &p->vMapPiF2A, &p->vReg2Frame );
    vReasons = Saig_ManCbaFindReason( p );
    if ( p->vReg2Frame )
        Saig_ManCbaShrink( p );


//if ( fVerbose )
//Aig_ManPrintStats( p->pFrames );

    if ( fVerbose )
    {
        Vec_Int_t * vRes = Saig_ManCbaReason2Inputs( p, vReasons );
        printf( "Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",
            Aig_ManCiNum(p->pFrames), Vec_IntSize(vReasons), 
            Saig_ManPiNum(p->pAig) - p->nInputs, Vec_IntSize(vRes) );
        Vec_IntFree( vRes );
ABC_PRT( "Time", Abc_Clock() - clk );
    }

    pCare = Saig_ManCbaReason2Cex( p, vReasons );
    Vec_IntFree( vReasons );
    Saig_ManCbaStop( p );

if ( fVerbose )
{
printf( "Real " );
Abc_CexPrintStats( pCex );
}
if ( fVerbose )
{
printf( "Care " );
Abc_CexPrintStats( pCare );
}
/*
    // verify the reduced counter-example using ternary simulation
    if ( !Saig_ManCexVerifyUsingTernary( pAig, pCex, pCare ) )
        printf( "Saig_ManCbaFindCexCareBits(): Minimized counter-example verification has failed!!!\n" );
    else if ( fVerbose )
        printf( "Saig_ManCbaFindCexCareBits(): Minimized counter-example verification is successful.\n" );
*/
    Aig_ManCleanMarkAB( pAig );
    return pCare;
}